

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_file_close(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue obj;
  long *plVar1;
  ssize_t sVar2;
  undefined4 in_ECX;
  int64_t in_RSI;
  JSValueUnion in_RDI;
  undefined8 in_R8;
  int err;
  JSSTDFile *s;
  undefined4 local_64;
  undefined4 in_stack_ffffffffffffffb0;
  JSValueUnion local_30;
  int64_t local_28;
  undefined4 uStack_c;
  
  obj.tag = in_RSI;
  obj.u.ptr = in_RDI.ptr;
  plVar1 = (long *)JS_GetOpaque2((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),obj,
                                 (JSClassID)((ulong)in_R8 >> 0x20));
  if (plVar1 == (long *)0x0) {
    local_30.ptr = (void *)(local_30 << 0x20);
    local_28 = 6;
  }
  else if (*plVar1 == 0) {
    _local_30 = JS_ThrowTypeError((JSContext *)in_RDI.ptr,"invalid file handle");
  }
  else {
    if (*(int *)((long)plVar1 + 0xc) == 0) {
      fclose((FILE *)*plVar1);
      sVar2 = js_get_errno(0x10e8e1);
      local_64 = (undefined4)sVar2;
    }
    else {
      pclose((FILE *)*plVar1);
      sVar2 = js_get_errno(0x10e8c6);
      local_64 = (undefined4)sVar2;
    }
    *plVar1 = 0;
    local_30._4_4_ = uStack_c;
    local_30.int32 = local_64;
    local_28 = 0;
  }
  return _local_30;
}

Assistant:

static JSValue js_std_file_close(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSSTDFile *s = JS_GetOpaque2(ctx, this_val, js_std_file_class_id);
    int err;
    if (!s)
        return JS_EXCEPTION;
    if (!s->f)
        return JS_ThrowTypeError(ctx, "invalid file handle");
    if (s->is_popen)
        err = js_get_errno(pclose(s->f));
    else
        err = js_get_errno(fclose(s->f));
    s->f = NULL;
    return JS_NewInt32(ctx, err);
}